

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNegativePartialUpdateTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::anon_unknown_0::NotPostableTest::iterate(NotPostableTest *this)

{
  deUint32 dVar1;
  deBool dVar2;
  EGLBoolean got;
  Library *egl_00;
  TestLog *log_00;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  ScopedLogSection local_68 [3];
  undefined4 local_4c;
  EGLint EStack_48;
  int bufferAge;
  EGLint damageRegion [4];
  CallLogWrapper wrapper;
  TestLog *log;
  Library *egl;
  NotPostableTest *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_NegativePartialUpdateTest).super_TestCase.m_eglTestCtx);
  log_00 = tcu::TestContext::getLog
                     ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  eglu::CallLogWrapper::CallLogWrapper((CallLogWrapper *)(damageRegion + 2),egl_00,log_00);
  _EStack_48 = 0xa0000000a;
  damageRegion[0] = 10;
  damageRegion[1] = 10;
  local_4c = 0xffffffff;
  eglu::CallLogWrapper::enableLogging((CallLogWrapper *)(damageRegion + 2),true);
  tcu::TestContext::setTestResult
            ((this->super_NegativePartialUpdateTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Test1",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"If the surface is pbuffer (not postable) --> EGL_BAD_MATCH",
             &local_b1);
  tcu::ScopedLogSection::ScopedLogSection(local_68,log_00,&local_88,&local_b0);
  tcu::ScopedLogSection::~ScopedLogSection(local_68);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  do {
    (*egl_00->_vptr_Library[0x30])
              (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
               (this->super_NegativePartialUpdateTest).m_eglSurface,0x3093,0x3095);
    dVar1 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0xfa);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    (*egl_00->_vptr_Library[0x2b])
              (egl_00,(this->super_NegativePartialUpdateTest).m_eglDisplay,
               (this->super_NegativePartialUpdateTest).m_eglSurface,0x313d,&local_4c);
    dVar1 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,
                     "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglNegativePartialUpdateTests.cpp"
                     ,0xfb);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  got = eglu::CallLogWrapper::eglSetDamageRegionKHR
                  ((CallLogWrapper *)(damageRegion + 2),
                   (this->super_NegativePartialUpdateTest).m_eglDisplay,
                   (this->super_NegativePartialUpdateTest).m_eglSurface,&EStack_48,1);
  NegativePartialUpdateTest::expectFalse(&this->super_NegativePartialUpdateTest,got);
  NegativePartialUpdateTest::expectError(&this->super_NegativePartialUpdateTest,0x3009);
  eglu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)(damageRegion + 2));
  return STOP;
}

Assistant:

TestCase::IterateResult NotPostableTest::iterate (void)
{
	const Library&			egl				= m_eglTestCtx.getLibrary();
	TestLog&				log				= m_testCtx.getLog();
	CallLogWrapper			wrapper			(egl, log);
	EGLint					damageRegion[]	= { 10, 10, 10, 10 };
	int						bufferAge		= -1;

	wrapper.enableLogging(true);
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	{
		tcu::ScopedLogSection(log, "Test1", "If the surface is pbuffer (not postable) --> EGL_BAD_MATCH");
		EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));
		EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_KHR, &bufferAge));
		expectFalse(wrapper.eglSetDamageRegionKHR(m_eglDisplay, m_eglSurface, damageRegion, DE_LENGTH_OF_ARRAY(damageRegion)/4));
		expectError(EGL_BAD_MATCH);
	}

	return STOP;
}